

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::StickyAtypeParameters> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::StickyAtypeParameters> *)0x2d03d8);
  operator_delete(in_RDI,0x68);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}